

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OmegaOP.cpp
# Opt level: O0

void __thiscall
OmegaOP::algoSMOOTHING(OmegaOP *this,vector<double,_std::allocator<double>_> *data,double minAngle)

{
  double dVar1;
  bool bVar2;
  size_type sVar3;
  double **ppdVar4;
  double dVar5;
  uint local_68;
  uint local_64;
  uint u;
  uint t;
  uint v;
  uint T;
  uint temp_indState;
  int temp_chpt;
  double temp_Q;
  double temp_cost;
  uint local_38;
  int iStack_34;
  Costs cost;
  uint p;
  uint n;
  double minAngle_local;
  vector<double,_std::allocator<double>_> *data_local;
  OmegaOP *this_local;
  
  _p = minAngle;
  minAngle_local = (double)data;
  data_local = (vector<double,_std::allocator<double>_> *)this;
  sVar3 = std::vector<double,_std::allocator<double>_>::size(data);
  iStack_34 = (int)sVar3;
  local_38 = this->nbStates;
  Costs::Costs((Costs *)((long)&temp_cost + 7));
  temp_Q = 0.0;
  _temp_indState = -1.0;
  T = 0xffffffff;
  v = 0;
  ppdVar4 = preprocessing(this,(vector<double,_std::allocator<double>_> *)minAngle_local);
  this->S12P = ppdVar4;
  for (t = 2; t < iStack_34 + 1U; t = t + 1) {
    for (u = 0; u < local_38; u = u + 1) {
      _temp_indState = INFINITY;
      v = 0;
      T = 0;
      for (local_64 = 1; local_64 < t; local_64 = local_64 + 1) {
        for (local_68 = 0; local_68 < local_38; local_68 = local_68 + 1) {
          bVar2 = Costs::angleTest((Costs *)((long)&temp_cost + 7),
                                   this->lastChpt[local_68] + local_64,&local_64,&t,
                                   this->states + this->lastIndState[local_68][local_64],
                                   this->states + local_68,this->states + u,(double *)&p);
          if (bVar2) {
            dVar1 = this->Q[local_68][local_64];
            dVar5 = Costs::slopeCost((Costs *)((long)&temp_cost + 7),this->states + local_68,
                                     this->states + u,&local_64,&t,*this->S12P + local_64,
                                     *this->S12P + t,this->S12P[1] + local_64,this->S12P[1] + t,
                                     this->S12P[2] + local_64,this->S12P[2] + t);
            temp_Q = dVar1 + dVar5 + this->penalty;
            if (temp_Q < _temp_indState) {
              v = local_68;
              T = local_64;
              _temp_indState = temp_Q;
            }
          }
        }
      }
      this->Q[u][t] = _temp_indState;
      this->lastChpt[u][t] = T;
      this->lastIndState[u][t] = v;
    }
  }
  this->pruning = 1.0;
  return;
}

Assistant:

void OmegaOP::algoSMOOTHING(std::vector< double >& data, double minAngle)
{
  unsigned int n = data.size();
  unsigned int p = nbStates;
  Costs cost;
  double temp_cost = 0;
  double temp_Q = -1;
  int temp_chpt = -1;
  unsigned int temp_indState = 0;

  /// PREPROCESSING
  S12P = preprocessing(data);

  ///
  /// ALGO
  /// states u to v -> time position t to T
  /// explore in (u,t) for fixed (v,T)
  ///
  for(unsigned int T = 2; T < (n + 1); T++)
  {
    for(unsigned int v = 0; v < p; v++)
    {
      ///// EXPLORE MATRIX size p*T
      temp_Q = INFINITY;
      temp_indState = 0;
      temp_chpt = 0;

      for(unsigned int t = 1; t < T; t++)
      {
        for(unsigned int u = 0; u < p; u++) /////explore column of states
        {
          if(cost.angleTest(lastChpt[u][t], t, T, states[lastIndState[u][t]], states[u], states[v], minAngle))
          {
            temp_cost = Q[u][t] + cost.slopeCost(states[u], states[v], t, T, S12P[0][t], S12P[0][T], S12P[1][t], S12P[1][T], S12P[2][t], S12P[2][T]) + penalty;
            //std::cout <<" t2 "<<  t << " v2 " << states[u] << " t3 "<< T <<" v3 " << states[v] << " cost  " << temp_cost;
            if(temp_Q > temp_cost)
            {
              temp_Q = temp_cost;
              temp_indState = u;
              temp_chpt = t;
            }
          }
          //std::cout << std::endl;
        }

      }
      ///// Write response
      Q[v][T] = temp_Q;
      lastChpt[v][T] = temp_chpt;
      lastIndState[v][T] = temp_indState;
    }
  }
  pruning = 1;

}